

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGen::AppendFilenameSuffix_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,string_view filename,string_view suffix)

{
  size_type __n;
  string_view filename_local;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  filename_local._M_str = (char *)filename._M_len;
  filename_local._M_len = (size_t)this;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                  (&filename_local,'.',0xffffffffffffffff);
  local_60.View_._M_len = (size_t)filename._M_str;
  local_60.View_._M_str = (char *)suffix._M_len;
  if (__n == 0xffffffffffffffff) {
    local_90.View_._M_str = filename_local._M_str;
    local_90.View_._M_len = filename_local._M_len;
    cmStrCat<>(__return_storage_ptr__,&local_90,&local_60);
  }
  else {
    local_90.View_ =
         std::basic_string_view<char,_std::char_traits<char>_>::substr(&filename_local,0,__n);
    local_a0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&filename_local,__n,filename_local._M_len - __n);
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>>
              (__return_storage_ptr__,&local_90,&local_60,&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::AppendFilenameSuffix(cm::string_view filename,
                                              cm::string_view suffix)
{
  auto dotPos = filename.rfind('.');
  if (dotPos == cm::string_view::npos) {
    return cmStrCat(filename, suffix);
  }
  return cmStrCat(filename.substr(0, dotPos), suffix,
                  filename.substr(dotPos, filename.size() - dotPos));
}